

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodeGenerate.cpp
# Opt level: O0

LocalNameInfo * __thiscall
luna::CodeGenerateVisitor::SearchFunctionLocalName
          (CodeGenerateVisitor *this,GenerateFunction *function,String *name)

{
  bool bVar1;
  pointer ppVar2;
  long in_RSI;
  iterator it;
  GenerateBlock *block;
  _Node_iterator_base<std::pair<luna::String_*const,_luna::LocalNameInfo>,_false>
  in_stack_ffffffffffffffc8;
  _Node_iterator_base<std::pair<luna::String_*const,_luna::LocalNameInfo>,_false> local_30;
  undefined8 *local_28;
  
  local_28 = *(undefined8 **)(in_RSI + 8);
  while( true ) {
    if (local_28 == (undefined8 *)0x0) {
      return (LocalNameInfo *)0x0;
    }
    local_30._M_cur =
         (__node_type *)
         std::
         unordered_map<luna::String_*,_luna::LocalNameInfo,_std::hash<luna::String_*>,_std::equal_to<luna::String_*>,_std::allocator<std::pair<luna::String_*const,_luna::LocalNameInfo>_>_>
         ::find(in_stack_ffffffffffffffc8._M_cur,(key_type *)0x21e5ac);
    in_stack_ffffffffffffffc8._M_cur =
         (__node_type *)
         std::
         unordered_map<luna::String_*,_luna::LocalNameInfo,_std::hash<luna::String_*>,_std::equal_to<luna::String_*>,_std::allocator<std::pair<luna::String_*const,_luna::LocalNameInfo>_>_>
         ::end(in_stack_ffffffffffffffc8._M_cur);
    bVar1 = std::__detail::operator!=
                      (&local_30,
                       (_Node_iterator_base<std::pair<luna::String_*const,_luna::LocalNameInfo>,_false>
                        *)&stack0xffffffffffffffc8);
    if (bVar1) break;
    local_28 = (undefined8 *)*local_28;
  }
  ppVar2 = std::__detail::
           _Node_iterator<std::pair<luna::String_*const,_luna::LocalNameInfo>,_false,_false>::
           operator->((_Node_iterator<std::pair<luna::String_*const,_luna::LocalNameInfo>,_false,_false>
                       *)0x21e5e0);
  return &ppVar2->second;
}

Assistant:

const LocalNameInfo * SearchFunctionLocalName(GenerateFunction *function,
                                                      String *name) const
        {
            auto block = function->current_block_;
            while (block)
            {
                auto it = block->names_.find(name);
                if (it != block->names_.end())
                    return &it->second;
                else
                    block = block->parent_;
            }

            return nullptr;
        }